

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void ngai_get_first_last_indices(Integer g_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  C_Integer *pCVar4;
  char **ppcVar5;
  char *pcVar6;
  uint uVar7;
  Integer IVar8;
  Integer node;
  Integer IVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  global_array_t *pgVar19;
  long lVar20;
  global_array_t *pgVar21;
  long lVar22;
  long lVar23;
  int _ndim;
  long lVar24;
  ulong uVar25;
  C_Integer CVar26;
  Integer id;
  Integer _lo [7];
  Integer _hi [7];
  Integer index [7];
  Integer hi [7];
  Integer lo [7];
  Integer subscript [7];
  Integer map_offset [7];
  int _index [7];
  long local_328;
  long local_320;
  ulong local_318;
  ulong local_310;
  long local_308;
  int local_300;
  int local_2fc;
  long local_2f8 [8];
  long local_2b8 [8];
  Integer local_278 [8];
  Integer local_238 [8];
  Integer local_1f8 [7];
  long alStack_1c0 [9];
  long alStack_178 [8];
  int local_138 [66];
  
  pgVar21 = GA;
  lVar16 = g_a + 1000;
  sVar1 = GA[lVar16].ndim;
  lVar18 = (long)sVar1;
  if (lVar18 < 1) {
    lVar24 = 1;
  }
  else {
    lVar24 = 1;
    lVar14 = 0;
    do {
      lVar24 = lVar24 * GA[g_a + 1000].dims[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar18 != lVar14);
  }
  if (((long)GA[g_a + 1000].p_handle < 0) || (PGRP_LIST[GA[g_a + 1000].p_handle].mirrored == 0)) {
    if (sVar1 < 1) {
      return;
    }
    pgVar19 = GA + lVar16;
    lVar16 = 0;
    do {
      pgVar21[g_a + 1000].first[lVar16] = 0;
      pgVar21[g_a + 1000].last[lVar16] = -1;
      pgVar19->shm_length = -1;
      lVar16 = lVar16 + 1;
    } while (lVar18 != lVar16);
    return;
  }
  local_2fc = GA_Default_Proc_Group;
  GA_Default_Proc_Group = -1;
  local_310 = g_a;
  IVar8 = pnga_cluster_nnodes();
  node = pnga_cluster_nodeid();
  IVar9 = pnga_cluster_nprocs(node);
  lVar14 = node * lVar24;
  if (node != IVar8 + -1) {
    lVar24 = (long)((double)((node + 1) * lVar24) / (double)IVar8);
  }
  if (0 < sVar1) {
    lVar11 = 0;
    do {
      alStack_178[lVar11] = 0;
      if (lVar11 != 0) {
        lVar15 = 0;
        lVar20 = 0;
        do {
          lVar15 = lVar15 + GA[g_a + 1000].nblock[lVar20];
          lVar20 = lVar20 + 1;
        } while (lVar11 != lVar20);
        alStack_178[lVar11] = lVar15;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar18);
  }
  local_318 = (ulong)((double)lVar14 / (double)IVar8);
  lVar14 = -1;
  uVar25 = 0;
  if (IVar9 < 1) {
    local_320 = -1;
  }
  else {
    local_320 = -1;
    lVar11 = 0;
    do {
      pnga_proc_topology(local_310,lVar11,local_278);
      if (sVar1 < 1) {
        lVar15 = 1;
      }
      else {
        lVar15 = 1;
        lVar20 = 0;
        do {
          lVar22 = local_278[lVar20];
          if (lVar22 < (long)GA[g_a + 1000].nblock[lVar20] + -1) {
            lVar22 = GA[lVar16].mapc[alStack_178[lVar20] + lVar22 + 1] -
                     GA[lVar16].mapc[alStack_178[lVar20] + lVar22];
          }
          else {
            lVar22 = (GA[g_a + 1000].dims[lVar20] - GA[lVar16].mapc[alStack_178[lVar20] + lVar22]) +
                     1;
          }
          lVar15 = lVar15 * lVar22;
          lVar20 = lVar20 + 1;
        } while (lVar18 != lVar20);
      }
      uVar25 = uVar25 + lVar15;
      lVar15 = lVar14;
      if (lVar14 < 0) {
        lVar15 = lVar11;
      }
      if ((long)local_318 < (long)uVar25) {
        lVar14 = lVar15;
      }
      lVar15 = local_320;
      if (local_320 < 0) {
        lVar15 = lVar11;
      }
      if (lVar14 < 0) {
        lVar15 = local_320;
      }
      if (lVar24 <= (long)uVar25) {
        local_320 = lVar15;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != IVar9);
    uVar25 = 0;
    if (0 < lVar14) {
      lVar11 = 0;
      do {
        pnga_distribution(local_310,lVar11,local_1f8,local_238);
        lVar15 = 1;
        if (0 < sVar1) {
          lVar20 = 0;
          do {
            lVar22 = ((local_238[lVar20] - local_1f8[lVar20]) + 1) * lVar15;
            lVar15 = 0;
            if (local_1f8[lVar20] <= local_238[lVar20]) {
              lVar15 = lVar22;
            }
            lVar20 = lVar20 + 1;
          } while (lVar18 != lVar20);
        }
        uVar25 = uVar25 + lVar15;
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar14);
    }
  }
  local_318 = local_318 - uVar25;
  pnga_distribution(local_310,lVar14,local_1f8,local_238);
  lVar11 = lVar18 + -1;
  lVar15 = 1;
  if (1 < sVar1) {
    lVar20 = 0;
    do {
      lVar15 = lVar15 * ((local_238[lVar20] - local_1f8[lVar20]) + 1);
      lVar20 = lVar20 + 1;
    } while (lVar11 != lVar20);
  }
  lVar20 = ((long)local_318 / lVar15 + 1) - (ulong)((long)local_318 % lVar15 == 0);
  lVar15 = GA[lVar16].dims[lVar18 + -1] + -1;
  if (lVar20 < GA[lVar16].dims[lVar18 + -1]) {
    lVar15 = lVar20;
  }
  pnga_proc_topology(local_310,lVar14,local_278);
  alStack_1c0[lVar18] = lVar15;
  if (sVar1 < 2) {
    if (0 < sVar1) goto LAB_0016cb9c;
  }
  else {
    memset(alStack_1c0 + 1,0,lVar18 * 8 - 8);
LAB_0016cb9c:
    pgVar21 = GA;
    pCVar4 = GA[lVar16].mapc;
    lVar15 = 0;
    do {
      pgVar21[lVar16].first[lVar15] =
           alStack_1c0[lVar15 + 1] + pCVar4[alStack_178[lVar15] + local_278[lVar15]];
      lVar15 = lVar15 + 1;
    } while (lVar18 != lVar15);
  }
  if (lVar14 < local_320) {
    if (local_320 < 1) {
      uVar25 = 0;
    }
    else {
      uVar25 = 0;
      lVar14 = 0;
      do {
        pnga_distribution(local_310,lVar14,local_1f8,local_238);
        lVar15 = 1;
        if (0 < sVar1) {
          lVar20 = 0;
          do {
            lVar22 = ((local_238[lVar20] - local_1f8[lVar20]) + 1) * lVar15;
            lVar15 = 0;
            if (local_1f8[lVar20] <= local_238[lVar20]) {
              lVar15 = lVar22;
            }
            lVar20 = lVar20 + 1;
          } while (lVar18 != lVar20);
        }
        uVar25 = uVar25 + lVar15;
        lVar14 = lVar14 + 1;
      } while (lVar14 != local_320);
    }
  }
  uVar17 = local_310;
  pnga_distribution(local_310,local_320,local_1f8,local_238);
  if (sVar1 < 2) {
    alStack_1c0[lVar18] = lVar24 + ~uVar25;
  }
  else {
    lVar15 = 1;
    lVar14 = 0;
    do {
      lVar15 = lVar15 * ((local_238[lVar14] - local_1f8[lVar14]) + 1);
      lVar14 = lVar14 + 1;
    } while (lVar11 != lVar14);
    alStack_1c0[lVar18] = (long)(lVar24 + ~uVar25) / lVar15;
    if (1 < sVar1) {
      lVar24 = 0;
      do {
        alStack_1c0[lVar24 + 1] = local_238[lVar24] - local_1f8[lVar24];
        lVar24 = lVar24 + 1;
      } while (lVar11 != lVar24);
    }
  }
  pnga_proc_topology(uVar17,local_320,local_278);
  if (0 < sVar1) {
    lVar24 = 0;
    do {
      lVar14 = alStack_1c0[lVar24 + 1] + GA[lVar16].mapc[alStack_178[lVar24] + local_278[lVar24]];
      if (GA[g_a + 1000].dims[lVar24] <= lVar14) {
        lVar14 = GA[g_a + 1000].dims[lVar24];
      }
      GA[g_a + 1000].last[lVar24] = lVar14;
      lVar24 = lVar24 + 1;
    } while (lVar18 != lVar24);
  }
  uVar7 = GA[lVar16].type - 0x3e9;
  if ((uVar7 < 0x10) && ((0x806fU >> (uVar7 & 0x1f) & 1) != 0)) {
    local_320 = *(long *)(&DAT_001c65a0 + (ulong)uVar7 * 8);
  }
  else {
    pnga_error("type not supported",(long)GA[lVar16].type);
    local_320 = 0;
  }
  if (0 < sVar1) {
    memcpy(local_278,GA[g_a + 1000].first,lVar18 * 8);
  }
  pnga_locate(uVar17,local_278,&local_328);
  pgVar19 = GA;
  pgVar21 = GA + lVar16;
  sVar2 = GA[lVar16].ndim;
  uVar25 = (ulong)sVar2;
  iVar12 = GA[lVar16].distr_type;
  if (iVar12 - 1U < 3) {
    lVar24 = pgVar21->num_blocks[0];
    lVar14 = (long)(int)local_328 % lVar24;
    local_138[0] = (int)lVar14;
    if (1 < sVar2) {
      lVar15 = 0;
      lVar11 = local_328;
      do {
        lVar11 = (long)((int)lVar11 - (int)lVar14) / lVar24;
        lVar24 = GA[g_a + 1000].num_blocks[lVar15 + 1];
        lVar14 = (long)(int)lVar11 % lVar24;
        local_138[lVar15 + 1] = (int)lVar14;
        lVar15 = lVar15 + 1;
      } while ((uVar25 & 0xffffffff) - 1 != lVar15);
    }
    if (0 < sVar2) {
      lVar24 = 0;
      do {
        iVar12 = *(int *)((long)local_138 + lVar24);
        lVar14 = *(long *)((long)GA[g_a + 1000].block_dims + lVar24 * 2);
        *(long *)((long)local_2f8 + lVar24 * 2) = lVar14 * iVar12 + 1;
        lVar14 = ((long)iVar12 + 1) * lVar14;
        lVar11 = *(long *)((long)GA[g_a + 1000].dims + lVar24 * 2);
        if (lVar11 <= lVar14) {
          lVar14 = lVar11;
        }
        *(long *)((long)local_2b8 + lVar24 * 2) = lVar14;
        lVar24 = lVar24 + 4;
      } while ((uVar25 & 0xffffffff) << 2 != lVar24);
    }
LAB_0016cfde:
    iVar12 = GA[lVar16].p_handle;
    if (0 < sVar2) {
      local_300 = iVar12;
      local_308 = local_328;
      goto LAB_0016cff9;
    }
LAB_0016d2ca:
    lVar14 = 1;
    lVar24 = 0;
    uVar17 = uVar25;
    CVar26 = local_328;
  }
  else {
    if (iVar12 != 0) {
      if (iVar12 == 4) {
        lVar24 = pgVar21->num_blocks[0];
        lVar14 = (long)(int)local_328 % lVar24;
        local_138[0] = (int)lVar14;
        if (1 < sVar2) {
          lVar15 = 0;
          lVar11 = local_328;
          do {
            lVar11 = (long)((int)lVar11 - (int)lVar14) / lVar24;
            lVar24 = GA[g_a + 1000].num_blocks[lVar15 + 1];
            lVar14 = (long)(int)lVar11 % lVar24;
            local_138[lVar15 + 1] = (int)lVar14;
            lVar15 = lVar15 + 1;
          } while ((uVar25 & 0xffffffff) - 1 != lVar15);
        }
        if (0 < sVar2) {
          pCVar4 = GA[lVar16].mapc;
          lVar24 = 0;
          iVar12 = 0;
          do {
            iVar13 = *(int *)((long)local_138 + lVar24);
            lVar11 = (long)iVar12 + (long)iVar13;
            *(C_Integer *)((long)local_2f8 + lVar24 * 2) = pCVar4[lVar11];
            lVar14 = *(long *)((long)pgVar21->num_blocks + lVar24 * 2);
            if ((long)iVar13 < lVar14 + -1) {
              lVar11 = pCVar4[lVar11 + 1] + -1;
            }
            else {
              lVar11 = *(long *)((long)pgVar21->dims + lVar24 * 2);
            }
            *(long *)((long)local_2b8 + lVar24 * 2) = lVar11;
            iVar12 = iVar12 + (int)lVar14;
            lVar24 = lVar24 + 4;
          } while ((uVar25 & 0xffffffff) << 2 != lVar24);
        }
      }
      goto LAB_0016cfde;
    }
    if (pgVar21->num_rstrctd == 0) {
      if (0 < sVar2) {
        lVar24 = 1;
        uVar17 = 0;
        do {
          lVar24 = lVar24 * GA[g_a + 1000].nblock[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar25 != uVar17);
        if (local_328 < 0 || lVar24 <= local_328) goto LAB_0016d1ff;
        if (0 < sVar2) {
          pCVar4 = pgVar21->mapc;
          uVar17 = 0;
          lVar14 = 0;
          lVar24 = local_328;
          do {
            lVar15 = (long)GA[g_a + 1000].nblock[uVar17];
            lVar11 = lVar24 % lVar15;
            local_2f8[uVar17] = pCVar4[lVar11 + lVar14];
            if (lVar11 == lVar15 + -1) {
              CVar26 = GA[g_a + 1000].dims[uVar17];
            }
            else {
              CVar26 = pCVar4[lVar11 + lVar14 + 1] + -1;
            }
            lVar14 = lVar14 + lVar15;
            local_2b8[uVar17] = CVar26;
            uVar17 = uVar17 + 1;
            lVar24 = lVar24 / lVar15;
          } while (uVar25 != uVar17);
          goto LAB_0016cfde;
        }
      }
LAB_0016d2c2:
      iVar12 = GA[lVar16].p_handle;
      goto LAB_0016d2ca;
    }
    if (local_328 < pgVar21->num_rstrctd) {
      if (0 < sVar2) {
        lVar24 = 1;
        uVar17 = 0;
        do {
          lVar24 = lVar24 * GA[g_a + 1000].nblock[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar25 != uVar17);
        if ((local_328 < 0) || (lVar24 <= local_328)) goto LAB_0016d1ff;
        if (0 < sVar2) {
          pCVar4 = pgVar21->mapc;
          lVar14 = 0;
          uVar17 = 0;
          lVar24 = local_328;
          do {
            lVar15 = (long)GA[g_a + 1000].nblock[uVar17];
            lVar11 = lVar24 % lVar15;
            local_2f8[uVar17] = pCVar4[lVar11 + lVar14];
            if (lVar11 == lVar15 + -1) {
              CVar26 = GA[g_a + 1000].dims[uVar17];
            }
            else {
              CVar26 = pCVar4[lVar11 + lVar14 + 1] + -1;
            }
            lVar14 = lVar14 + lVar15;
            local_2b8[uVar17] = CVar26;
            uVar17 = uVar17 + 1;
            lVar24 = lVar24 / lVar15;
          } while (uVar25 != uVar17);
          goto LAB_0016cfde;
        }
      }
      goto LAB_0016d2c2;
    }
LAB_0016d1ff:
    if (sVar2 < 1) goto LAB_0016d2c2;
    local_308 = local_328;
    memset(local_2f8,0,uVar25 * 8);
    memset(local_2b8,0xff,uVar25 * 8);
    local_300 = pgVar19[lVar16].p_handle;
LAB_0016cff9:
    lVar24 = 0;
    local_318 = uVar25;
    do {
      if ((pgVar19[g_a + 1000].first[lVar24] < local_2f8[lVar24]) ||
         (local_2b8[lVar24] < pgVar19[g_a + 1000].first[lVar24])) {
        sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
        pnga_error((char *)local_138,lVar24);
        pgVar19 = GA;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < pgVar19[lVar16].ndim);
    pgVar21 = pgVar19 + lVar16;
    lVar14 = 1;
    lVar24 = 0;
    uVar17 = local_318;
    CVar26 = local_308;
    iVar12 = local_300;
    if (1 < (short)local_318) {
      lVar11 = 0;
      do {
        lVar24 = lVar24 + ((pgVar21->width[lVar11] + pgVar21->first[lVar11]) - local_2f8[lVar11]) *
                          lVar14;
        lVar14 = (((pgVar21->width[lVar11] * 2 + 1) - local_2f8[lVar11]) + local_2b8[lVar11]) *
                 lVar14;
        lVar11 = lVar11 + 1;
      } while (uVar25 - 1 != lVar11);
    }
  }
  lVar11 = pgVar21->width[uVar17 + 6];
  lVar15 = *(long *)(&local_300 + uVar17 * 2);
  lVar20 = pgVar21->width[uVar17 - 1];
  if (iVar12 == 0) {
    CVar26 = (C_Integer)PGRP_LIST->inv_map_proc_list[CVar26];
  }
  if (0 < pgVar21->num_rstrctd) {
    CVar26 = pgVar21->rstrctd_list[CVar26];
  }
  ppcVar5 = pgVar21->ptr;
  iVar12 = pgVar21->elemsize;
  if (0 < sVar1) {
    lVar22 = 0;
    do {
      local_278[lVar22] = pgVar19[g_a + 1000].last[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar18 != lVar22);
  }
  pcVar6 = ppcVar5[CVar26];
  pnga_locate(local_310,local_278,&local_328);
  pgVar19 = GA;
  pgVar21 = GA + lVar16;
  sVar1 = GA[lVar16].ndim;
  uVar25 = (ulong)sVar1;
  iVar13 = GA[lVar16].distr_type;
  if (iVar13 - 1U < 3) {
    lVar18 = pgVar21->num_blocks[0];
    lVar22 = (long)(int)local_328 % lVar18;
    local_138[0] = (int)lVar22;
    if (1 < sVar1) {
      lVar23 = 0;
      lVar10 = local_328;
      do {
        lVar10 = (long)((int)lVar10 - (int)lVar22) / lVar18;
        lVar18 = GA[g_a + 1000].num_blocks[lVar23 + 1];
        lVar22 = (long)(int)lVar10 % lVar18;
        local_138[lVar23 + 1] = (int)lVar22;
        lVar23 = lVar23 + 1;
      } while ((uVar25 & 0xffffffff) - 1 != lVar23);
    }
    if (0 < sVar1) {
      lVar18 = 0;
      do {
        iVar13 = *(int *)((long)local_138 + lVar18);
        lVar22 = *(long *)((long)GA[g_a + 1000].block_dims + lVar18 * 2);
        *(long *)((long)local_2f8 + lVar18 * 2) = lVar22 * iVar13 + 1;
        lVar22 = ((long)iVar13 + 1) * lVar22;
        lVar10 = *(long *)((long)GA[g_a + 1000].dims + lVar18 * 2);
        if (lVar10 <= lVar22) {
          lVar22 = lVar10;
        }
        *(long *)((long)local_2b8 + lVar18 * 2) = lVar22;
        lVar18 = lVar18 + 4;
      } while ((uVar25 & 0xffffffff) << 2 != lVar18);
    }
LAB_0016d546:
    iVar13 = GA[lVar16].p_handle;
    if (sVar1 < 1) {
LAB_0016d838:
      lVar22 = 1;
      lVar18 = 0;
      local_318 = local_328;
      goto LAB_0016d83f;
    }
    local_308 = CONCAT44(local_308._4_4_,iVar13);
    local_318 = local_328;
  }
  else {
    if (iVar13 != 0) {
      if (iVar13 == 4) {
        lVar18 = pgVar21->num_blocks[0];
        lVar22 = (long)(int)local_328 % lVar18;
        local_138[0] = (int)lVar22;
        if (1 < sVar1) {
          lVar23 = 0;
          lVar10 = local_328;
          do {
            lVar10 = (long)((int)lVar10 - (int)lVar22) / lVar18;
            lVar18 = GA[g_a + 1000].num_blocks[lVar23 + 1];
            lVar22 = (long)(int)lVar10 % lVar18;
            local_138[lVar23 + 1] = (int)lVar22;
            lVar23 = lVar23 + 1;
          } while ((uVar25 & 0xffffffff) - 1 != lVar23);
        }
        if (0 < sVar1) {
          pCVar4 = GA[lVar16].mapc;
          lVar18 = 0;
          iVar13 = 0;
          do {
            iVar3 = *(int *)((long)local_138 + lVar18);
            lVar10 = (long)iVar13 + (long)iVar3;
            *(C_Integer *)((long)local_2f8 + lVar18 * 2) = pCVar4[lVar10];
            lVar22 = *(long *)((long)pgVar21->num_blocks + lVar18 * 2);
            if ((long)iVar3 < lVar22 + -1) {
              lVar10 = pCVar4[lVar10 + 1] + -1;
            }
            else {
              lVar10 = *(long *)((long)pgVar21->dims + lVar18 * 2);
            }
            *(long *)((long)local_2b8 + lVar18 * 2) = lVar10;
            iVar13 = iVar13 + (int)lVar22;
            lVar18 = lVar18 + 4;
          } while ((uVar25 & 0xffffffff) << 2 != lVar18);
        }
      }
      goto LAB_0016d546;
    }
    if (pgVar21->num_rstrctd == 0) {
      if (0 < sVar1) {
        lVar18 = 1;
        uVar17 = 0;
        do {
          lVar18 = lVar18 * GA[g_a + 1000].nblock[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar25 != uVar17);
        if (local_328 < 0 || lVar18 <= local_328) goto LAB_0016d76d;
        if (0 < sVar1) {
          pCVar4 = pgVar21->mapc;
          lVar22 = 0;
          uVar17 = 0;
          lVar18 = local_328;
          do {
            lVar23 = (long)GA[g_a + 1000].nblock[uVar17];
            lVar10 = lVar18 % lVar23;
            local_2f8[uVar17] = pCVar4[lVar10 + lVar22];
            if (lVar10 == lVar23 + -1) {
              CVar26 = GA[g_a + 1000].dims[uVar17];
            }
            else {
              CVar26 = pCVar4[lVar10 + lVar22 + 1] + -1;
            }
            lVar22 = lVar22 + lVar23;
            local_2b8[uVar17] = CVar26;
            uVar17 = uVar17 + 1;
            lVar18 = lVar18 / lVar23;
          } while (uVar25 != uVar17);
          goto LAB_0016d546;
        }
      }
LAB_0016d830:
      iVar13 = GA[lVar16].p_handle;
      goto LAB_0016d838;
    }
    if (local_328 < pgVar21->num_rstrctd) {
      if (0 < sVar1) {
        lVar18 = 1;
        uVar17 = 0;
        do {
          lVar18 = lVar18 * GA[g_a + 1000].nblock[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar25 != uVar17);
        if ((local_328 < 0) || (lVar18 <= local_328)) goto LAB_0016d76d;
        if (0 < sVar1) {
          pCVar4 = pgVar21->mapc;
          lVar22 = 0;
          uVar17 = 0;
          lVar18 = local_328;
          do {
            lVar23 = (long)GA[g_a + 1000].nblock[uVar17];
            lVar10 = lVar18 % lVar23;
            local_2f8[uVar17] = pCVar4[lVar10 + lVar22];
            if (lVar10 == lVar23 + -1) {
              CVar26 = GA[g_a + 1000].dims[uVar17];
            }
            else {
              CVar26 = pCVar4[lVar10 + lVar22 + 1] + -1;
            }
            lVar22 = lVar22 + lVar23;
            local_2b8[uVar17] = CVar26;
            uVar17 = uVar17 + 1;
            lVar18 = lVar18 / lVar23;
          } while (uVar25 != uVar17);
          goto LAB_0016d546;
        }
      }
      goto LAB_0016d830;
    }
LAB_0016d76d:
    if (sVar1 < 1) goto LAB_0016d830;
    local_318 = local_328;
    memset(local_2f8,0,uVar25 * 8);
    memset(local_2b8,0xff,uVar25 * 8);
    local_308 = CONCAT44(local_308._4_4_,pgVar19[lVar16].p_handle);
  }
  lVar18 = 0;
  local_310 = uVar25;
  do {
    if ((pgVar19[g_a + 1000].last[lVar18] < local_2f8[lVar18]) ||
       (local_2b8[lVar18] < pgVar19[g_a + 1000].last[lVar18])) {
      sprintf((char *)local_138,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
      pnga_error((char *)local_138,lVar18);
      pgVar19 = GA;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 < pgVar19[lVar16].ndim);
  pgVar21 = pgVar19 + lVar16;
  lVar22 = 1;
  if ((short)local_310 < 2) {
    lVar18 = 0;
  }
  else {
    lVar10 = 0;
    lVar18 = 0;
    do {
      lVar18 = lVar18 + ((pgVar21->width[lVar10] + pgVar21->last[lVar10]) - local_2f8[lVar10]) *
                        lVar22;
      lVar22 = (((pgVar21->width[lVar10] * 2 + 1) - local_2f8[lVar10]) + local_2b8[lVar10]) * lVar22
      ;
      lVar10 = lVar10 + 1;
    } while (uVar25 - 1 != lVar10);
  }
  uVar25 = local_310;
  iVar13 = (int)local_308;
LAB_0016d83f:
  if (iVar13 == 0) {
    local_318 = (ulong)PGRP_LIST->inv_map_proc_list[local_318];
  }
  if (0 < pgVar21->num_rstrctd) {
    local_318 = pgVar21->rstrctd_list[local_318];
  }
  pgVar19[lVar16].shm_length =
       (C_Long)(pgVar21->ptr[local_318] +
               (local_320 -
               (long)(pcVar6 + (((lVar11 - lVar15) + lVar20) * lVar14 + lVar24) * (long)iVar12)) +
               (((pgVar21->first[uVar25 + 6] - *(long *)(&local_300 + uVar25 * 2)) +
                pgVar21->width[uVar25 - 1]) * lVar22 + lVar18) * (long)pgVar21->elemsize);
  GA_Default_Proc_Group = local_2fc;
  return;
}

Assistant:

void ngai_get_first_last_indices( Integer g_a)  /* array handle (input) */
{

  Integer  lo[MAXDIM], hi[MAXDIM];
  Integer  nelems, nnodes, inode, nproc;
  Integer  ifirst, ilast, nfirst, nlast, icnt, np;
  Integer  i, j, itmp, ndim, map_offset[MAXDIM];
  /* Integer  icheck; */
  Integer  index[MAXDIM], subscript[MAXDIM];
  Integer  handle = GA_OFFSET + g_a;
  Integer  type, size=0, id;
  /* Integer  grp_id; */
  int Save_default_group;
  char     *fptr, *lptr;

  /* find total number of elements */
  ndim = GA[handle].ndim;
  nelems = 1;
  for (i=0; i<ndim; i++) nelems *= GA[handle].dims[i];

  /* If array is mirrored, evaluate first and last indices */
  if (pnga_is_mirrored(g_a)) {
    /* If default group is not world group, change default group to world group
       temporarily */
    Save_default_group = GA_Default_Proc_Group;
    GA_Default_Proc_Group = -1;
    nnodes = pnga_cluster_nnodes();
    inode = pnga_cluster_nodeid();
    nproc = pnga_cluster_nprocs(inode);
    /* grp_id = GA[handle].p_handle; */
    ifirst = (Integer)((double)(inode*nelems)/((double)nnodes));
    if (inode != nnodes-1) {
      ilast = (Integer)((double)((inode+1)*nelems)/((double)nnodes))-1;
    } else {
      ilast = nelems-1;
    }
    /* ifirst and ilast correspond to offsets in shared memory. Find the
       actual indices of the data elements corresponding to these offsets.
       The map_offset array provides a convenient mechanism for extracting
       the first indices on each processor along each coordinate dimension
       from the mapc array. */
    for (i = 0; i<ndim; i++) {
      map_offset[i] = 0;
      for (j = 0; j<i; j++) {
        map_offset[i] += GA[handle].nblock[j];
      }
    }
    icnt = 0;
    nfirst = -1;
    nlast = -1;
    for (i = 0; i<nproc; i++) {
      /* find block indices corresponding to proc i */
      pnga_proc_topology(g_a, i, index);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (index[j] < GA[handle].nblock[j]-1) {
          
          itmp = ((Integer)GA[handle].mapc[map_offset[j]+index[j]+1]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]]);
          nelems *= itmp;
        } else {
          itmp = ((Integer)GA[handle].dims[j]
               - (Integer)GA[handle].mapc[map_offset[j]+index[j]] + 1);
          nelems *= itmp;
        }
      }
      icnt += nelems;
      if (icnt-1 >= ifirst && nfirst < 0) {
        nfirst = i;
      }
      if (ilast <= icnt-1 && nfirst >= 0 && nlast < 0) {
        nlast = i;
      }
    }
    /* Adjust indices corresponding to start and end of block of
       shared memory so that it can be decomposed into large
       rectangular blocks of the global array. Start by
       adusting the lower index */
    icnt = 0;
    for (i = 0; i<nfirst; i++) {
      pnga_distribution(g_a, i, lo, hi);
      nelems = 1;
      for (j = 0; j<ndim; j++) {
        if (hi[j] >= lo[j]) {
          nelems *= (hi[j] - lo[j] + 1);
        } else {
          nelems = 0;
        }
      }
      icnt += nelems;
    }
    /* calculate offset in local block of memory */
    ifirst = ifirst - icnt;
    /* find dimensions of data on block nfirst */
    np = nfirst;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    if (ifirst%nelems == 0) {
      ifirst = ifirst/nelems;
    } else {
      ifirst = (ifirst-ifirst%nelems)/nelems;
      ifirst++;
    }
    if (ifirst > GA[handle].dims[ndim-1]-1) ifirst=GA[handle].dims[ndim-1]-1;
    /* adjust value of ifirst */
    pnga_proc_topology(g_a, nfirst, index);
    subscript[ndim-1] = ifirst;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = 0;
    }
    /* Finally, evaluate absolute indices of first data point */
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
    }
    /* adjust upper bound. If nlast = nfirst, just use old value of icnt */
    if (nlast > nfirst) {
      icnt = 0;
      for (i = 0; i<nlast; i++) {
        pnga_distribution(g_a, i, lo, hi);
        nelems = 1;
        for (j = 0; j<ndim; j++) {
          if (hi[j] >= lo[j]) {
            nelems *= (hi[j] - lo[j] + 1);
          } else {
            nelems = 0;
          }
        }
        icnt += nelems;
      }
    }
    ilast = ilast - icnt;
    /* find dimensions of data on block nlast */
    np = nlast;
    pnga_distribution(g_a, np, lo, hi);
    nelems = 1;
    for (i=0; i<ndim-1; i++) {
      nelems *= (hi[i] - lo[i] + 1);
    }
    ilast = (ilast-ilast%nelems)/nelems;
    /* adjust value of ilast */
    subscript[ndim-1] = ilast;
    for (i=0; i<ndim-1; i++) {
      subscript[i] = (hi[i] - lo[i]);
    }
    pnga_proc_topology(g_a, nlast, index);
    /*
    icheck = 1;
    for (i=1; i<ndim; i++) {
      if (index[i] < GA[handle].nblock[i]-1) {
        itmp = (Integer)GA[handle].mapc[map_offset[i]+index[i]+1]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]];
      } else {
        itmp = (Integer)GA[handle].dims[i]
             - (Integer)GA[handle].mapc[map_offset[i]+index[i]] + 1;
      }
      if (subscript[i] < itmp-1) icheck = 0;
      subscript[i] = itmp-1;
    }
    if (!icheck) {
      subscript[0]--;
    } */
    /* Finally, evaluate absolute indices of last data point */
    for (i=0; i<ndim; i++) {
      GA[handle].last[i] = GA[handle].mapc[map_offset[i]+index[i]]
                          + (C_Integer)subscript[i];
      if (GA[handle].last[i] > GA[handle].dims[i]) {
        GA[handle].last[i] = GA[handle].dims[i];
      }
    }
    /* find length of shared memory segment owned by this node. Adjust
     * length, if necessary, to account for gaps in memory between
     * processors */
    type = GA[handle].type;
    switch(type) {
      case C_FLOAT: size = sizeof(float); break;
      case C_DBL: size = sizeof(double); break;
      case C_LONG: size = sizeof(long); break;
      case C_LONGLONG: size = sizeof(long long); break;
      case C_INT: size = sizeof(int); break;
      case C_SCPL: size = 2*sizeof(float); break;
      case C_DCPL: size = 2*sizeof(double); break;
      default: pnga_error("type not supported",type);
    }
    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].first[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].first, &fptr);

    for (i=0; i<ndim; i++) index[i] = (Integer)GA[handle].last[i];
    i = (int)pnga_locate(g_a, index, &id);
    gam_Loc_ptr(id, handle, (Integer)GA[handle].last, &lptr);

    GA[handle].shm_length = (C_Long)(lptr - fptr + size);
    GA_Default_Proc_Group = Save_default_group;
  } else {
    for (i=0; i<ndim; i++) {
      GA[handle].first[i] = 0;
      GA[handle].last[i] = -1;
      GA[handle].shm_length = -1;
    }
  }
}